

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

void __thiscall
LinkedListPool<depspawn::internal::Workitem,_true,_false>::allocate
          (LinkedListPool<depspawn::internal::Workitem,_true,_false> *this)

{
  Workitem *pWVar1;
  __atomic_flag_data_type _Var2;
  int iVar3;
  int iVar4;
  Workitem *pWVar5;
  Workitem *last_datain;
  Workitem *h;
  
  iVar3 = this->chunkSize_;
  iVar4 = this->minTSize_;
  h = (Workitem *)malloc((long)(iVar4 * iVar3));
  last_datain = (Workitem *)((long)&h->_vptr_Workitem + (long)((iVar3 + -1) * iVar4));
  pWVar5 = h;
  do {
    pWVar1 = (Workitem *)((long)&pWVar5->_vptr_Workitem + (long)iVar4);
    pWVar5->_vptr_Workitem = (_func_int **)&PTR__Workitem_00115920;
    (pWVar5->deps_mutex_).super___atomic_flag_base._M_i = false;
    pWVar5->next = pWVar1;
    pWVar5 = pWVar1;
  } while (pWVar1 <= last_datain);
  do {
    LOCK();
    _Var2 = (this->pool_mutex_).super___atomic_flag_base._M_i;
    (this->pool_mutex_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var2 != false);
  std::vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>::
  push_back(&this->v_,&h);
  freeLinkedList(this,h,last_datain,true);
  (this->pool_mutex_).super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

void allocate() {
    char * baseptr = PoolAllocator_malloc_free<SCALABLE>::malloc(chunkSize_ * minTSize_);
    char * const endptr = baseptr +  minTSize_ * (chunkSize_ - 1);
    T * const h = reinterpret_cast<T *>(baseptr);
    T * const q = reinterpret_cast<T *>(endptr);
    T * p = h;
    do {
      baseptr += minTSize_;
      if (ALLOC_ONCE) {
        new (p) T();
      }
      p->next = reinterpret_cast<T *>(baseptr); //invalid for p=q. Will be corrected during linking
      p = static_cast<T *>(p->next);
    } while (baseptr <= endptr);
    
    while (pool_mutex_.test_and_set(std::memory_order_acquire));
    
    v_.push_back(h);

    freeLinkedList(h, q, true);
    
    pool_mutex_.clear(std::memory_order_release);
  }